

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  allocator<int> *this_00;
  ulong uVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pbVar6;
  long lVar7;
  reference pvVar8;
  reference pvVar9;
  pointer pbVar10;
  iterator __first;
  iterator __last;
  string local_150 [36];
  int local_12c;
  ulong uStack_128;
  int r;
  size_t i_2;
  string s;
  undefined1 local_100 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_f0;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  _List_node_base *local_d0;
  iterator local_c8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  iterator local_b8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  const_iterator i_1;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> perm;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  size_t result;
  int j;
  string local_50 [8];
  string sub;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subs;
  int n;
  
  subs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size._4_4_ = 0;
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&subs.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size);
  std::istream::ignore();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_28);
  for (local_2c = 0;
      local_2c <
      (int)subs.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node._M_size; local_2c = local_2c + 1) {
    std::__cxx11::string::string(local_50);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
    poVar4 = std::operator<<((ostream *)&std::cerr,local_50);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_28,(value_type *)local_50);
    std::__cxx11::string::~string(local_50);
  }
  result._0_4_ = 0;
  pieces.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_28);
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_80,sVar5,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7));
  sVar5 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_28);
  this_00 = (allocator<int> *)((long)&i_1._M_node + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,sVar5,this_00);
  std::allocator<int>::~allocator((allocator<int> *)((long)&i_1._M_node + 7));
  local_b8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator(&local_b0,&local_b8);
  while( true ) {
    local_c8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_c0,&local_c8);
    bVar3 = std::operator!=(&local_b0,&local_c0);
    if (!bVar3) break;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,(long)(int)result);
    *pvVar8 = (int)result;
    pbVar6 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_b0);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_80,(long)(int)result);
    std::__cxx11::string::operator=((string *)pvVar9,(string *)pbVar6);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->(&local_b0);
    lVar7 = std::__cxx11::string::length();
    pieces.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         pieces.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar7;
    result._0_4_ = (int)result + 1;
    local_d0 = (_List_node_base *)
               std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&local_b0,0);
  }
  do {
    local_d8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_a0);
    local_e0 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a0);
    std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_f0,(ostream_type *)&std::cerr,", ");
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_100,local_d8
               ,local_e0);
    std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_a0,0);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_80,(long)*pvVar8);
    std::__cxx11::string::string((string *)&i_2,(string *)pvVar9);
    for (uStack_128 = 1; uVar1 = uStack_128,
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_a0), uVar1 < sVar5;
        uStack_128 = uStack_128 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a0,uStack_128);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_80,(long)*pvVar8);
      local_12c = get_intersection((string *)&i_2,pvVar9);
      poVar4 = std::operator<<((ostream *)&std::cerr,"r is ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_12c);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_150,(ulong)&i_2);
      std::__cxx11::string::operator=((string *)&i_2,local_150);
      std::__cxx11::string::~string(local_150);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a0,uStack_128);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_80,(long)*pvVar8);
      std::__cxx11::string::operator+=((string *)&i_2,(string *)pvVar9);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&i_2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pbVar2 = pieces.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar10 = (pointer)std::__cxx11::string::length();
    if (pbVar10 < pbVar2) {
      pieces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::length();
    }
    std::__cxx11::string::~string((string *)&i_2);
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_a0);
    __last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_a0);
    bVar3 = std::
            next_permutation<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __first._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __last._M_current);
  } while (bVar3);
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (ulong)pieces.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  subs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_28);
  return subs.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node._M_size._4_4_;
}

Assistant:

int main()
{
	int n;
	std::cin >> n;
	std::cin.ignore();
	
	std::list<std::string> subs;
	for (int i = 0; i < n; i++)
	{
	    std::string sub;
		std::getline(std::cin, sub);
		std::cerr << sub << std::endl;
        subs.push_back(sub);
	}
	
	int j = 0;
	size_t result = 0;
	std::vector<std::string> pieces(subs.size());
	std::vector<int> perm(subs.size());
	for (std::list<std::string>::const_iterator i = subs.begin(); i != subs.end(); i++)
	{
	    perm[j] = j;
	    pieces[j] = *i;
	    result += i->length();
	    j++;
	}

	do
	{
	    copy(perm.begin(), perm.end(), std::ostream_iterator<int>(std::cerr, ", "));
	    std::cerr << std::endl;
	    
	    std::string s = pieces[perm[0]];
	    for (size_t i = 1; i < perm.size(); i++)
	    {
	        int r = get_intersection(s, pieces[perm[i]]);
	        std::cerr << "r is " << r << std::endl;
	        s = s.substr(0, s.length() - r);
	        s += pieces[perm[i]];
	    }
	    std::cerr << s << std::endl;
	    if (result > s.length())
	    {
	        result = s.length();
	    }
	} while (next_permutation(perm.begin(), perm.end()));

    std::cout << result << std::endl;

    return 0;
}